

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall
r_exec::NotificationView::NotificationView
          (NotificationView *this,Code *origin,Code *destination,Code *marker)

{
  long lVar1;
  Atom local_24 [4];
  
  View::View(&this->super_View);
  (this->super_View).super_View.super__Object._vptr__Object = (_func_int **)&PTR__View_001d3650;
  r_code::Atom::SSet((ushort)local_24,(uchar)View::ViewOpcode);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x28,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::Float(0.0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x2c,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::IPointer((ushort)local_24);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x30,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::Float(1.0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x34,local_24);
  r_code::Atom::~Atom(local_24);
  lVar1 = r_code::Mem::Get();
  r_code::Atom::Float((float)*(ulong *)(lVar1 + 0x88));
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x38,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::RPointer((ushort)local_24);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x3c,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::RPointer((ushort)local_24);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x40,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::Timestamp();
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x44,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::Atom(local_24,0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x48,local_24);
  r_code::Atom::~Atom(local_24);
  r_code::Atom::Atom(local_24,0);
  r_code::Atom::operator=((Atom *)&(this->super_View).super_View.field_0x4c,local_24);
  r_code::Atom::~Atom(local_24);
  (this->super_View).super_View.references[0] = destination;
  (this->super_View).super_View.references[1] = origin;
  View::reset_init_sln(&this->super_View);
  core::P<r_code::Code>::operator=(&(this->super_View).super_View.object,marker);
  return;
}

Assistant:

NotificationView::NotificationView(Code *origin, Code *destination, Code *marker): View()
{
    code(VIEW_OPCODE) = r_code::Atom::SSet(ViewOpcode, VIEW_ARITY); // Structured Set.
    code(VIEW_SYNC) = r_code::Atom::Float(View::SYNC_ONCE); // sync once.
    code(VIEW_IJT) = r_code::Atom::IPointer(VIEW_ARITY + 1); // iptr to ijt.
    code(VIEW_SLN) = r_code::Atom::Float(1); // sln.
    code(VIEW_RES) = r_code::Atom::Float(_Mem::Get()->get_ntf_mk_res()); // res.
    code(VIEW_HOST) = r_code::Atom::RPointer(0); // destination.
    code(VIEW_ORG) = r_code::Atom::RPointer(1); // origin.
    code(VIEW_ARITY + 1) = r_code::Atom::Timestamp(); // ijt will be set at injection time.
    code(VIEW_ARITY + 2) = 0;
    code(VIEW_ARITY + 3) = 0;
    references[0] = destination;
    references[1] = origin;
    reset_init_sln();
    object = marker;
}